

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_math.cpp
# Opt level: O2

int ON_SearchMonotoneArray(double *array,int length,double t)

{
  double *pdVar1;
  bool bVar2;
  double *pdVar3;
  int iVar4;
  uint uVar5;
  long lVar6;
  double *pdVar7;
  long lVar8;
  double dVar9;
  
  if (length < 1 || array == (double *)0x0) {
    iVar4 = -2;
  }
  else if (*array <= t) {
    bVar2 = array[length - 1U] <= t;
    if (bVar2) {
      uVar5 = length - 1U;
      if (bVar2 && t != array[length - 1U]) {
        uVar5 = length;
      }
      return uVar5;
    }
    iVar4 = 0;
    if (array[1] <= t) {
      if (array[(long)length + -2] <= t) {
        return length + -2;
      }
      lVar6 = -1;
      dVar9 = *array;
      do {
        lVar8 = lVar6 + 2;
        lVar6 = lVar6 + 1;
        bVar2 = dVar9 == array[lVar8];
        dVar9 = array[lVar8];
      } while (bVar2);
      pdVar3 = array + (uint)length;
      do {
        pdVar7 = pdVar3 + -1;
        length = length + -1;
        pdVar1 = pdVar3 + -2;
        pdVar3 = pdVar7;
      } while (*pdVar7 == *pdVar1);
      do {
        iVar4 = (int)lVar6;
        while( true ) {
          if (length <= iVar4 + 1) {
            return iVar4;
          }
          lVar8 = (long)(length + iVar4 >> 1);
          if (array[lVar8] <= t) break;
          do {
            pdVar3 = array + lVar8;
            lVar6 = lVar8 + -1;
            lVar8 = lVar8 + -1;
          } while (*pdVar3 == array[lVar6]);
          length = (int)lVar8 + 1;
        }
        lVar6 = lVar8 + -1;
        dVar9 = array[lVar8];
        do {
          lVar8 = lVar6 + 2;
          lVar6 = lVar6 + 1;
          bVar2 = dVar9 == array[lVar8];
          dVar9 = array[lVar8];
        } while (bVar2);
      } while( true );
    }
  }
  else {
    iVar4 = -1;
  }
  return iVar4;
}

Assistant:

int 
ON_SearchMonotoneArray(const double* array, int length, double t)
/*****************************************************************************
Find interval in an increasing array of doubles
 
INPUT:
  array
    A monotone increasing (array[i] <= array[i+1]) array of length doubles.
  length (>=1)
    number of doubles in array
  t
    parameter
OUTPUT:
  ON_GetdblArrayIndex()
    -1:         t < array[0]
     i:         (0 <= i <= length-2) array[i] <= t < array[i+1]
     length-1:  t == array[length-1]
     length:    t  > array[length-1]
COMMENTS:
  If length < 1 or array is not monotone increasing, you will get a meaningless
  answer and may crash your program.
EXAMPLE:
  // Given a "t", find the knots that define the span used to evaluate a
  // nurb at t; i.e., find "i" so that
  // knot[i] <= ... <= knot[i+order-2] 
  //   <= t < knot[i+order-1] <= ... <= knot[i+2*(order-1)-1]
  i = ON_GetdblArrayIndex(knot+order-2,cv_count-order+2,t);
  if (i < 0) i = 0; else if (i > cv_count - order) i = cv_count - order;
RELATED FUNCTIONS:
  ON_
  ON_
*****************************************************************************/

{                 
  int 
    i, i0, i1;

  if (0 == array || length < 1)
    return -2; // check for empty input to prevent crashes RH-23451

  length--;

  /* Since t is frequently near the ends and bisection takes the
   * longest near the ends, trap those cases here.
   */
  if (t < array[0]) 
    return -1;
  if (t >= array[length])
    return (t > array[length]) ? length+1 : length;
  if (t < array[1])
    return 0;
  if (t >= array[length-1])
    return (length-1);


  i0 = 0;
  i1 = length;
  while (array[i0] == array[i0+1]) i0++;
  while (array[i1] == array[i1-1]) i1--;
  /* From now on we have 
   *  1.) array[i0] <= t < array[i1] 
   *  2.) i0 <= i < i1.
   * When i0+1 == i1, we have array[i0] <= t < array[i0+1] 
   * and i0 is the answer we seek.
   */
  while (i0+1 < i1) {
    i = (i0+i1)>>1;
    if (t < array[i]) {
      i1 = i;
      while (array[i1] == array[i1-1]) i1--;
    }
    else {
      i0 = i;
      while (array[i0] == array[i0+1]) i0++;
    }
  }

  return i0;
}